

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathContainsFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  uint uVar1;
  xmlXPathObjectPtr pxVar2;
  ulong uVar3;
  xmlChar *pxVar4;
  xmlXPathObjectPtr value;
  uint uVar5;
  xmlXPathObjectPtr *ppxVar6;
  int code;
  xmlXPathObjectPtr pxVar7;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 2) {
    code = 0xc;
    goto LAB_001bf4fa;
  }
  uVar1 = ctxt->valueNr;
  if ((int)uVar1 < 2) {
    code = 0x17;
    goto LAB_001bf4fa;
  }
  if (ctxt->value != (xmlXPathObjectPtr)0x0) {
    if (ctxt->value->type == XPATH_STRING) {
      uVar5 = uVar1 - 1;
      ctxt->valueNr = uVar5;
      ppxVar6 = ctxt->valueTab;
LAB_001bf3cd:
      uVar3 = (ulong)uVar5;
      pxVar7 = ppxVar6[(ulong)uVar1 - 2];
LAB_001bf3d6:
      ctxt->value = pxVar7;
      uVar1 = (uint)uVar3;
      pxVar7 = ppxVar6[uVar3];
      ppxVar6[uVar3] = (xmlXPathObjectPtr)0x0;
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
        uVar1 = ctxt->valueNr;
      }
      if (0 < (int)uVar1) {
        uVar5 = uVar1 - 1;
        ctxt->valueNr = uVar5;
        ppxVar6 = ctxt->valueTab;
        if (uVar1 == 1) {
          pxVar2 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar2 = ppxVar6[(ulong)uVar1 - 2];
        }
        ctxt->value = pxVar2;
        pxVar2 = ppxVar6[uVar5];
        ppxVar6[uVar5] = (xmlXPathObjectPtr)0x0;
        if (pxVar2 != (xmlXPathObjectPtr)0x0) {
          if (pxVar2->type == XPATH_STRING) {
            pxVar4 = xmlStrstr(pxVar2->stringval,pxVar7->stringval);
            value = xmlXPathCacheNewBoolean(ctxt,(uint)(pxVar4 != (xmlChar *)0x0));
            xmlXPathValuePush(ctxt,value);
            xmlXPathReleaseObject(ctxt->context,pxVar2);
            xmlXPathReleaseObject(ctxt->context,pxVar7);
            return;
          }
          xmlXPathReleaseObject(ctxt->context,pxVar2);
        }
      }
    }
    else {
      xmlXPathStringFunction(ctxt,1);
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
      goto LAB_001bf4f2;
      uVar1 = ctxt->valueNr;
      uVar3 = 0;
      if (0 < (int)uVar1) {
        uVar5 = uVar1 - 1;
        ctxt->valueNr = uVar5;
        ppxVar6 = ctxt->valueTab;
        if (uVar1 != 1) goto LAB_001bf3cd;
        pxVar7 = (xmlXPathObjectPtr)0x0;
        goto LAB_001bf3d6;
      }
      pxVar7 = (xmlXPathObjectPtr)0x0;
    }
    xmlXPathReleaseObject(ctxt->context,pxVar7);
  }
LAB_001bf4f2:
  code = 0xb;
LAB_001bf4fa:
  xmlXPathErr(ctxt,code);
  return;
}

Assistant:

void
xmlXPathContainsFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr hay, needle;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    needle = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    hay = xmlXPathValuePop(ctxt);

    if ((hay == NULL) || (hay->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, hay);
	xmlXPathReleaseObject(ctxt->context, needle);
	XP_ERROR(XPATH_INVALID_TYPE);
    }
    if (xmlStrstr(hay->stringval, needle->stringval))
	xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, 1));
    else
	xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, 0));
    xmlXPathReleaseObject(ctxt->context, hay);
    xmlXPathReleaseObject(ctxt->context, needle);
}